

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter.cpp
# Opt level: O0

MeasureVector __thiscall
testExtendedKalmanFilterZeroInput()::KalmanFunctor::measureDynamics(Eigen::
Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__long_
          (void *this,StateVector *x,InputVector *u,TimeIndex k)

{
  Index extraout_RDX;
  CoeffReturnType CVar1;
  MeasureVector MVar2;
  non_const_type local_150;
  Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_148;
  double local_138;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_130;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_f0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_e0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_98;
  undefined1 local_31;
  TimeIndex k_local;
  InputVector *u_local;
  StateVector *x_local;
  KalmanFunctor *this_local;
  MeasureVector *yk;
  
  local_31 = 0;
  k_local = k;
  u_local = u;
  x_local = x;
  this_local = (KalmanFunctor *)this;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)this);
  local_f0 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(x + 6),
                        (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_local);
  local_150 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_local);
  local_148 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>> *)
                         &local_150,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_local);
  CVar1 = Eigen::
          DenseCoeffsBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_0>
          ::operator[]((DenseCoeffsBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_0>
                        *)&local_148,0);
  local_138 = cos(CVar1 * 10.0);
  Eigen::operator*(&local_130,&local_138,
                   (StorageBaseType *)
                   &x[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>>
  ::operator+(&local_e0,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
               *)&local_f0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)&local_130);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
  ::operator+(&local_98,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
               *)&local_e0,
              (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              &x[3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
  ;
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,_1,1,0,_1,1> *)this,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_98);
  MVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  MVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (MeasureVector)
         MVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

virtual ekf::MeasureVector measureDynamics(const ekf::StateVector & x,
                                               const ekf::InputVector & u,
                                               stateObservation::TimeIndex k)
    {
      (void)k; // unused
      (void)u; // unused

      ekf::MeasureVector yk;
      yk = c_ * x + cos(10 * (x.transpose() * x)[0]) * m_ + n_;
      return yk;
    }